

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::line_style
          (Fl_PostScript_Graphics_Driver *this,int style,int width,char *dashes)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  double *pdVar7;
  
  this->linewidth_ = width;
  this->linestyle_ = style;
  pcVar5 = this->linedash_;
  if (dashes == (char *)0x0) {
    *pcVar5 = '\0';
  }
  else if (pcVar5 != dashes) {
    strcpy(pcVar5,dashes);
  }
  uVar4 = width + (uint)(width == 0);
  fprintf((FILE *)this->output,"%i setlinewidth\n",(ulong)uVar4);
  if (style == 0) {
    style = 0;
    if (dashes == (char *)0x0) {
      if (width != 0) goto LAB_001fc249;
    }
    else {
      style = 0;
      if ((width != 0) || (*dashes != '\0')) goto LAB_001fc249;
    }
    style = 0x300;
  }
LAB_001fc249:
  uVar2 = (uint)style >> 8 & 0xf;
  uVar3 = (ulong)(uVar2 - 1);
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  fprintf((FILE *)this->output,"%i setlinecap\n",uVar3);
  uVar2 = (uint)style >> 0xc & 0xf;
  uVar3 = (ulong)(uVar2 - 1);
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  fprintf((FILE *)this->output,"%i setlinejoin\n",uVar3);
  fputc(0x5b,(FILE *)this->output);
  if ((dashes == (char *)0x0) || (cVar1 = *dashes, cVar1 == '\0')) {
    if (((uint)style >> 9 & 1) == 0) {
      for (piVar6 = dashes_flat[style & 0xffU]; -1 < *piVar6; piVar6 = piVar6 + 1) {
        fprintf((FILE *)this->output,"%i ",(ulong)(*piVar6 * uVar4));
      }
    }
    else {
      for (pdVar7 = dashes_cap[style & 0xffU]; 0.0 <= *pdVar7; pdVar7 = pdVar7 + 1) {
        clocale_printf(this,"%g ",*pdVar7 * (double)(int)uVar4);
      }
    }
  }
  else {
    pcVar5 = dashes + 1;
    while (cVar1 != '\0') {
      fprintf((FILE *)this->output,"%i ",(ulong)(uint)(int)cVar1);
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    }
  }
  fwrite("] 0 setdash\n",0xc,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::line_style(int style, int width, char* dashes){
  //line_styled_=1;
  
  linewidth_=width;
  linestyle_=style;
  //dashes_= dashes;
  if(dashes){
    if(dashes != linedash_)
      strcpy(linedash_,dashes);
    
  }else
    linedash_[0]=0;
  char width0 = 0;
  if(!width){
    width=1; //for screen drawing compatibility
    width0=1;
  }
  
  fprintf(output, "%i setlinewidth\n", width);
  
  if(!style && (!dashes || !(*dashes)) && width0) //system lines
    style = FL_CAP_SQUARE;
  
  int cap = (style &0xf00) >> 8;
  if(cap) cap--;
  fprintf(output,"%i setlinecap\n", cap);
  
  int join = (style & 0xf000) >> 12;
  
  if(join) join--;
  fprintf(output,"%i setlinejoin\n", join);
  
  
  fprintf(output, "[");
  if(dashes && *dashes){
    while(*dashes){
      fprintf(output, "%i ", *dashes);
      dashes++;
    }
  }else{
    if(style & 0x200){ // round and square caps, dash length need to be adjusted
      const double *dt = dashes_cap[style & 0xff];
      while (*dt >= 0){
        clocale_printf("%g ",width * (*dt));
        dt++;
      }
    }else{
      
      const int *ds = dashes_flat[style & 0xff];
      while (*ds >= 0){
	fprintf(output, "%i ",width * (*ds));
        ds++;
      }
    }
  }
  fprintf(output, "] 0 setdash\n");
}